

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

ClosureContext __thiscall
runtime::VirtualMachine::loadClosure(VirtualMachine *this,ClosureContext *closure)

{
  Function **ppFVar1;
  ulong uVar2;
  ClosureContext CVar3;
  string local_78;
  element_type *local_58;
  shared_ptr<runtime::StackFrame> outer;
  element_type *local_40;
  shared_ptr<runtime::StackFrame> scope;
  
  local_40 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&((scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&((scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&((scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (1 < closure->scopeOffsets) {
    uVar2 = 1;
    do {
      ppFVar1 = &local_40->function;
      local_40 = ((*ppFVar1)->scopeOuter).
                 super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((*ppFVar1)->scopeOuter).
           super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->locals).
                   super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
                   .super__Vector_impl_data._M_start =
               *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->locals).
                        super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->locals).
                   super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
                   .super__Vector_impl_data._M_start =
               *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->locals).
                        super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      local_58 = local_40;
      if (local_40 == (element_type *)0x0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"No outer scope found for closure","");
        panic((VirtualMachine *)
              outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi,&local_78);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&scope,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&outer);
      if (outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < closure->scopeOffsets);
  }
  uVar2 = closure->localIndex;
  if (uVar2 < (ulong)((long)(local_40->locals).
                            super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_40->locals).
                            super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    if (scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    CVar3.scopeIndex = uVar2;
    CVar3.stackFrame = local_40;
    return CVar3;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "closure.localIndex out of bounds for scope when trying to find closure value","");
  panic((VirtualMachine *)
        outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
        &local_78);
}

Assistant:

runtime::ClosureContext runtime::VirtualMachine::loadClosure(const bytecode::ClosureContext& closure) {
  // we start at offset of 1 because those offsets are determined from within the function scope
  // are we are not technically within the function scope also offset of zero means local
  auto scope = this->stackFrame;
  for (std::size_t i = 1; i < closure.scopeOffsets; i++) {
    auto outer = scope->function->scopeOuter;
    if (outer == nullptr) {
      this->panic("No outer scope found for closure");
    }
    scope = outer;
  }

  if (closure.localIndex >= scope->locals.size()) {
    this->panic("closure.localIndex out of bounds for scope when trying to find closure value");
  }

  runtime::ClosureContext cc;
  cc.stackFrame = scope.get();
  cc.scopeIndex = closure.localIndex;
  return cc;
}